

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<IntVar_*>_>::growTo(vec<vec<IntVar_*>_> *this,uint size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (*(uint *)this < size) {
    reserve(this,size);
    uVar1 = *(uint *)this;
    if (uVar1 < size) {
      lVar4 = (ulong)size - (ulong)uVar1;
      lVar3 = (ulong)uVar1 << 4;
      do {
        lVar2 = *(long *)(this + 8);
        *(undefined8 *)(lVar2 + lVar3) = 0;
        ((undefined8 *)(lVar2 + lVar3))[1] = 0;
        lVar3 = lVar3 + 0x10;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    *(uint *)this = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}